

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O2

void __thiscall
LinkedObjectFile::symbol_link_offset
          (LinkedObjectFile *this,int source_segment,int source_offset,char *name)

{
  reference this_00;
  reference pvVar1;
  
  if ((source_offset & 3U) != 0) {
    __assert_fail("(source_offset % 4) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                  ,0x94,"void LinkedObjectFile::symbol_link_offset(int, int, const char *)");
  }
  this_00 = std::
            vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
            ::at(&this->words_by_seg,(long)source_segment);
  pvVar1 = std::vector<LinkedWord,_std::allocator<LinkedWord>_>::at
                     (this_00,(long)(source_offset >> 2));
  if (pvVar1->kind == PLAIN_DATA) {
    pvVar1->kind = SYM_OFFSET;
    std::__cxx11::string::assign((char *)&pvVar1->symbol_name);
    return;
  }
  __assert_fail("word.kind == LinkedWord::PLAIN_DATA",
                "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                ,0x96,"void LinkedObjectFile::symbol_link_offset(int, int, const char *)");
}

Assistant:

void LinkedObjectFile::symbol_link_offset(int source_segment, int source_offset, const char* name) {
  assert((source_offset % 4) == 0);
  auto& word = words_by_seg.at(source_segment).at(source_offset / 4);
  assert(word.kind == LinkedWord::PLAIN_DATA);
  word.kind = LinkedWord::SYM_OFFSET;
  word.symbol_name = name;
}